

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSelect(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Expression *pEVar1;
  Type local_58;
  ThreeArgs local_50;
  uintptr_t local_38;
  Type local_30;
  Type subType2;
  Type subType1;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  subType2 = type;
  type_00 = getSubType(this,type);
  local_38 = type.id;
  local_30 = getSubType(this,type);
  Type::Type(&local_58,i32);
  local_50.a = make(this,local_58);
  local_50.b = make(this,type_00);
  local_50.c = make(this,local_30);
  pEVar1 = buildSelect(this,&local_50,type);
  return pEVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeSelect(Type type) {
  Type subType1 = getSubType(type);
  Type subType2 = getSubType(type);
  return buildSelect({make(Type::i32), make(subType1), make(subType2)}, type);
}